

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAParseCharGroup(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  
  iVar1 = ctxt->neg;
  pxVar2 = ctxt->cur;
  xVar3 = *pxVar2;
  if (xVar3 != '^') goto LAB_0017fc34;
  ctxt->cur = pxVar2 + 1;
  ctxt->neg = (uint)(iVar1 == 0);
  xmlFAParsePosCharGroup(ctxt);
  ctxt->neg = iVar1;
  while( true ) {
    pxVar2 = ctxt->cur;
    xVar3 = *pxVar2;
LAB_0017fc34:
    if (xVar3 == ']') {
      return;
    }
    if (ctxt->error != 0) {
      return;
    }
    if ((xVar3 == '-') && (pxVar2[1] == '[')) break;
    xmlFAParsePosCharGroup(ctxt);
  }
  ctxt->cur = pxVar2 + 2;
  ctxt->neg = 2;
  xmlFAParseCharGroup(ctxt);
  ctxt->neg = iVar1;
  if (*ctxt->cur == ']') {
    ctxt->cur = ctxt->cur + 1;
    return;
  }
  ctxt->error = 0x5aa;
  xmlRegexpErrCompile(ctxt,"charClassExpr: \']\' expected");
  return;
}

Assistant:

static void
xmlFAParseCharGroup(xmlRegParserCtxtPtr ctxt) {
    int neg = ctxt->neg;

    if (CUR == '^') {
	NEXT;
	ctxt->neg = !ctxt->neg;
	xmlFAParsePosCharGroup(ctxt);
	ctxt->neg = neg;
    }
    while ((CUR != ']') && (ctxt->error == 0)) {
	if ((CUR == '-') && (NXT(1) == '[')) {
	    NEXT;	/* eat the '-' */
	    NEXT;	/* eat the '[' */
	    ctxt->neg = 2;
	    xmlFAParseCharGroup(ctxt);
	    ctxt->neg = neg;
	    if (CUR == ']') {
		NEXT;
	    } else {
		ERROR("charClassExpr: ']' expected");
	    }
	    break;
	} else {
	    xmlFAParsePosCharGroup(ctxt);
	}
    }
}